

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  byte *pbVar2;
  undefined8 local_28;
  size_type ed;
  int bg;
  string *s_local;
  
  ed._4_4_ = 0;
  local_28 = std::__cxx11::string::size();
  for (; (ulong)(long)ed._4_4_ < local_28; ed._4_4_ = ed._4_4_ + 1) {
    pbVar2 = (byte *)std::__cxx11::string::operator[]((ulong)s);
    iVar1 = isspace((uint)*pbVar2);
    if (iVar1 == 0) break;
  }
  do {
    if (local_28 <= (ulong)(long)ed._4_4_) {
LAB_0012de44:
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
      return __return_storage_ptr__;
    }
    pbVar2 = (byte *)std::__cxx11::string::operator[]((ulong)s);
    iVar1 = isspace((uint)*pbVar2);
    if (iVar1 == 0) goto LAB_0012de44;
    local_28 = local_28 - 1;
  } while( true );
}

Assistant:

inline std::string trim(std::string s) {
    auto bg = 0;
    auto ed = s.size();
    // bg = s.find_first_not_of(" \n\r\t\v\f");
    // bg = bg == std::string::npos? 0 : bg;
    for (;bg < ed; ++bg) {
        if (!isspace(static_cast<unsigned char>(s[bg]))) {
            break;
        }
    }
    // ed = s.find_last_not_of(" \n\r\t\v\f");
    // ed = ed == std::string::npos? s.size() : ed+1;
    for (; ed > bg; --ed) {
        if (!isspace(static_cast<unsigned char>(s[ed]))) {
            break;
        }
    }
    return s.substr(bg, ed-bg);
}